

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O1

vector<Occupy,_std::allocator<Occupy>_> *
Common::analyzeOccupies
          (vector<Occupy,_std::allocator<Occupy>_> *__return_storage_ptr__,TaskHandle *head,
          size_t peak_memory,uint64_t origin_time)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Rb_tree_header *p_Var2;
  pointer pOVar3;
  element_type *peVar4;
  TaskHandle *pTVar5;
  pointer pOVar6;
  pointer pOVar7;
  vector<Occupy,std::allocator<Occupy>> *pvVar8;
  bool bVar9;
  result_type_conflict rVar10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  ulong uVar13;
  ulong uVar14;
  undefined8 extraout_RAX;
  _Rb_tree_header *p_Var15;
  int iVar16;
  long lVar17;
  int iVar18;
  pointer pOVar19;
  long lVar20;
  vector<Occupy,_std::allocator<Occupy>_> occupies_vec;
  anon_class_1_0_00000001 append;
  set<Occupy,_std::less<Occupy>,_std::allocator<Occupy>_> essentials;
  Random random;
  set<Occupy,_std::less<Occupy>,_std::allocator<Occupy>_> occupies;
  vector<Occupy,_std::allocator<Occupy>_> local_138;
  anon_class_1_0_00000001 local_119;
  undefined1 local_118 [16];
  element_type *local_108;
  _Rb_tree_const_iterator<Occupy> local_100;
  vector<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_> local_f8;
  _Rb_tree<OperandUsage,_OperandUsage,_std::_Identity<OperandUsage>,_std::less<OperandUsage>,_std::allocator<OperandUsage>_>
  _Stack_e0;
  bool local_b0;
  double local_a8;
  double dStack_a0;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_98;
  param_type local_90;
  vector<Occupy,std::allocator<Occupy>> *local_88;
  size_t local_80;
  uint64_t local_78;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_70;
  param_type local_68;
  _Rb_tree<Occupy,_Occupy,_std::_Identity<Occupy>,_std::less<Occupy>,_std::allocator<Occupy>_>
  local_60;
  
  local_118._0_8_ = (head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_118._8_8_ = (head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_)->_M_use_count + 1;
    }
  }
  iVar16 = 0;
  local_78 = origin_time;
  if ((element_type *)local_118._0_8_ != (element_type *)0x0) {
    iVar18 = 1;
    iVar16 = 0;
    do {
      ((element_type *)local_118._0_8_)->time_stamp = iVar18;
      if (((element_type *)local_118._0_8_)->execution_memory == peak_memory) {
        iVar16 = iVar18;
      }
      pTVar5 = &((element_type *)local_118._0_8_)->next;
      local_118._0_8_ =
           (((element_type *)local_118._0_8_)->next).
           super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8),
                 &(pTVar5->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
      iVar18 = iVar18 + 1;
    } while ((element_type *)local_118._0_8_ != (element_type *)0x0);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
  }
  if (0 < iVar16) {
    p_Var2 = &local_60._M_impl.super__Rb_tree_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)(head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)(head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                         _M_pi;
    if (local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
        super__Vector_impl_data._M_finish != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &((local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                    super__Vector_impl_data._M_finish)->gen).
                  super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
        UNLOCK();
      }
      else {
        p_Var1 = &((local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                    super__Vector_impl_data._M_finish)->gen).
                  super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      }
    }
    local_88 = (vector<Occupy,std::allocator<Occupy>> *)__return_storage_ptr__;
    local_80 = peak_memory;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    if ((element_type *)
        local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
        super__Vector_impl_data._M_start != (element_type *)0x0) {
      do {
        if (iVar16 < *(int *)((long)local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>.
                                    _M_impl.super__Vector_impl_data._M_start + 0x90)) {
          pOVar3 = (((vector<OperandUsage,_std::allocator<OperandUsage>_> *)
                    ((long)local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                           super__Vector_impl_data._M_start + 0x30))->
                   super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          for (pOVar19 = (((vector<OperandUsage,_std::allocator<OperandUsage>_> *)
                          ((long)local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 0x30))->
                         super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>)._M_impl.
                         super__Vector_impl_data._M_start; pOVar19 != pOVar3; pOVar19 = pOVar19 + 1)
          {
            peVar4 = (pOVar19->gen).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            if ((peVar4 != (element_type *)0x0) && (peVar4->time_stamp < iVar16)) {
              local_118._0_8_ =
                   (pOVar19->gen).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_118._8_8_ =
                   (pOVar19->gen).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_)->_M_use_count =
                       ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_)->
                       _M_use_count + 1;
                  UNLOCK();
                }
                else {
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_)->_M_use_count =
                       ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_)->
                       _M_use_count + 1;
                }
              }
              local_108 = (element_type *)
                          local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                          super__Vector_impl_data._M_start;
              local_100._M_node =
                   (_Base_ptr)
                   local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var1 = &((local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                              super__Vector_impl_data._M_finish)->gen).
                            super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
                  *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
                  UNLOCK();
                }
                else {
                  p_Var1 = &((local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                              super__Vector_impl_data._M_finish)->gen).
                            super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
                  *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
                }
              }
              _Stack_e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              _Stack_e0._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
              _Stack_e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_f8.
              super__Vector_base<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              _Stack_e0._M_impl._0_8_ = 0;
              local_f8.
              super__Vector_base<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_f8.
              super__Vector_base<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              _Stack_e0._M_impl.super__Rb_tree_header._M_header._M_left =
                   &_Stack_e0._M_impl.super__Rb_tree_header._M_header;
              _Stack_e0._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_b0 = false;
              local_a8 = 0.0;
              dStack_a0 = 0.0;
              p_Var11 = &p_Var2->_M_header;
              for (p_Var12 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
                  (_Rb_tree_header *)p_Var12 != (_Rb_tree_header *)0x0;
                  p_Var12 = (&p_Var12->_M_left)
                            [*(element_type **)(p_Var12 + 1) < (ulong)local_118._0_8_]) {
                if (*(element_type **)(p_Var12 + 1) >= (ulong)local_118._0_8_) {
                  p_Var11 = p_Var12;
                }
              }
              p_Var15 = p_Var2;
              if (((_Rb_tree_header *)p_Var11 != p_Var2) &&
                 (p_Var15 = (_Rb_tree_header *)p_Var11,
                 (ulong)local_118._0_8_ <
                 (element_type *)((_Rb_tree_header *)p_Var11)->_M_node_count)) {
                p_Var15 = p_Var2;
              }
              _Stack_e0._M_impl.super__Rb_tree_header._M_header._M_right =
                   _Stack_e0._M_impl.super__Rb_tree_header._M_header._M_left;
              if ((p_Var15 == p_Var2) &&
                 (bVar9 = analyzeOccupies::anon_class_1_0_00000001::operator()
                                    (&local_119,(Occupy *)local_118), bVar9)) {
                std::
                _Rb_tree<Occupy,Occupy,std::_Identity<Occupy>,std::less<Occupy>,std::allocator<Occupy>>
                ::_M_insert_unique<Occupy_const&>
                          ((_Rb_tree<Occupy,Occupy,std::_Identity<Occupy>,std::less<Occupy>,std::allocator<Occupy>>
                            *)&local_60,(Occupy *)local_118);
              }
              std::
              _Rb_tree<OperandUsage,_OperandUsage,_std::_Identity<OperandUsage>,_std::less<OperandUsage>,_std::allocator<OperandUsage>_>
              ::~_Rb_tree(&_Stack_e0);
              std::vector<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>::~vector
                        (&local_f8);
              if ((pointer)local_100._M_node != (pointer)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._M_node);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
              }
            }
          }
        }
        pTVar5 = (TaskHandle *)
                 ((long)local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                        super__Vector_impl_data._M_start + 0x80);
        local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(((TaskHandle *)
                       ((long)local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                              super__Vector_impl_data._M_start + 0x80))->
                      super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                    super__Vector_impl_data._M_finish,
                   &(pTVar5->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
      } while ((element_type *)
               local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
               super__Vector_impl_data._M_start != (element_type *)0x0);
    }
    if (local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
        super__Vector_impl_data._M_finish != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2) {
      p_Var12 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        Occupy::Occupy((Occupy *)local_118,(Occupy *)(p_Var12 + 1));
        Occupy::calculate((Occupy *)local_118,iVar16,local_80,local_78);
        std::vector<Occupy,_std::allocator<Occupy>_>::push_back(&local_138,(Occupy *)local_118);
        std::
        _Rb_tree<OperandUsage,_OperandUsage,_std::_Identity<OperandUsage>,_std::less<OperandUsage>,_std::allocator<OperandUsage>_>
        ::~_Rb_tree(&_Stack_e0);
        std::vector<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>::~vector
                  (&local_f8);
        if ((pointer)local_100._M_node != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._M_node);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
        }
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
      } while ((_Rb_tree_header *)p_Var12 != p_Var2);
    }
    pOVar7 = local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pOVar6 = local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_118._8_8_ = local_118._8_8_ & 0xffffffff00000000;
    local_108 = (element_type *)0x0;
    local_100._M_node = (_Base_ptr)(local_118 + 8);
    local_f8.super__Vector_base<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8.super__Vector_base<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_100._M_node;
    if (local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar13 = (long)local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                     super__Vector_impl_data._M_start >> 7;
      lVar17 = 0x3f;
      if (uVar13 != 0) {
        for (; uVar13 >> lVar17 == 0; lVar17 = lVar17 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Occupy*,std::vector<Occupy,std::allocator<Occupy>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Common::analyzeOccupies(std::shared_ptr<Task>&,unsigned_long,unsigned_long)::_lambda(Occupy_const&,Occupy_const&)_1_>>
                (local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                 super__Vector_impl_data._M_finish,((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<Occupy*,std::vector<Occupy,std::allocator<Occupy>>>,__gnu_cxx::__ops::_Iter_comp_iter<Common::analyzeOccupies(std::shared_ptr<Task>&,unsigned_long,unsigned_long)::_lambda(Occupy_const&,Occupy_const&)_1_>>
                (pOVar6,pOVar7);
    }
    uVar13 = (long)local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                   super__Vector_impl_data._M_start;
    iVar16 = (int)(uVar13 >> 7);
    if (0 < iVar16) {
      lVar20 = (ulong)(iVar16 != 1) + 1;
      lVar17 = 0;
      do {
        std::_Rb_tree<Occupy,Occupy,std::_Identity<Occupy>,std::less<Occupy>,std::allocator<Occupy>>
        ::_M_insert_unique<Occupy_const&>
                  ((_Rb_tree<Occupy,Occupy,std::_Identity<Occupy>,std::less<Occupy>,std::allocator<Occupy>>
                    *)local_118,
                   (Occupy *)
                   ((long)&((local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                             super__Vector_impl_data._M_start)->gen).
                           super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr + lVar17));
        lVar17 = lVar17 + 0x80;
        lVar20 = lVar20 + -1;
      } while (lVar20 != 0);
    }
    pOVar7 = local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pOVar6 = local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar14 = (long)local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                     super__Vector_impl_data._M_start >> 7;
      lVar17 = 0x3f;
      if (uVar14 != 0) {
        for (; uVar14 >> lVar17 == 0; lVar17 = lVar17 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Occupy*,std::vector<Occupy,std::allocator<Occupy>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Common::analyzeOccupies(std::shared_ptr<Task>&,unsigned_long,unsigned_long)::_lambda(Occupy_const&,Occupy_const&)_2_>>
                (local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                 super__Vector_impl_data._M_finish,((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<Occupy*,std::vector<Occupy,std::allocator<Occupy>>>,__gnu_cxx::__ops::_Iter_comp_iter<Common::analyzeOccupies(std::shared_ptr<Task>&,unsigned_long,unsigned_long)::_lambda(Occupy_const&,Occupy_const&)_2_>>
                (pOVar6,pOVar7);
    }
    if (0 < iVar16) {
      lVar20 = (ulong)(iVar16 != 1) + 1;
      lVar17 = 0;
      do {
        std::_Rb_tree<Occupy,Occupy,std::_Identity<Occupy>,std::less<Occupy>,std::allocator<Occupy>>
        ::_M_insert_unique<Occupy_const&>
                  ((_Rb_tree<Occupy,Occupy,std::_Identity<Occupy>,std::less<Occupy>,std::allocator<Occupy>>
                    *)local_118,
                   (Occupy *)
                   ((long)&((local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                             super__Vector_impl_data._M_start)->gen).
                           super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr + lVar17));
        lVar17 = lVar17 + 0x80;
        lVar20 = lVar20 + -1;
      } while (lVar20 != 0);
    }
    local_70._M_x = 1;
    local_68._M_a = 0;
    local_68._M_b = 0;
    if ((local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
         super__Vector_impl_data._M_start !=
         local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
         super__Vector_impl_data._M_finish) &&
       (rVar10 = std::uniform_int_distribution<int>::operator()
                           ((uniform_int_distribution<int> *)&local_68,&local_70,&local_68),
       rVar10 == 0)) {
      local_98._M_x = 1;
      local_90._M_a = 0;
      local_90._M_b = 0x7fffffff;
      if (iVar16 < 1) {
        error("Min value should be less than max.\n");
        std::
        _Rb_tree<Occupy,_Occupy,_std::_Identity<Occupy>,_std::less<Occupy>,_std::allocator<Occupy>_>
        ::~_Rb_tree((_Rb_tree<Occupy,_Occupy,_std::_Identity<Occupy>,_std::less<Occupy>,_std::allocator<Occupy>_>
                     *)local_118);
        std::vector<Occupy,_std::allocator<Occupy>_>::~vector(&local_138);
        std::
        _Rb_tree<Occupy,_Occupy,_std::_Identity<Occupy>,_std::less<Occupy>,_std::allocator<Occupy>_>
        ::~_Rb_tree(&local_60);
        _Unwind_Resume(extraout_RAX);
      }
      local_98._M_x = 1;
      local_90 = (param_type)((uVar13 & 0xffffffffffffff80) * 0x2000000 + -0x100000000);
      rVar10 = std::uniform_int_distribution<int>::operator()
                         ((uniform_int_distribution<int> *)&local_90,&local_98,&local_90);
      std::_Rb_tree<Occupy,Occupy,std::_Identity<Occupy>,std::less<Occupy>,std::allocator<Occupy>>::
      _M_insert_unique<Occupy_const&>
                ((_Rb_tree<Occupy,Occupy,std::_Identity<Occupy>,std::less<Occupy>,std::allocator<Occupy>>
                  *)local_118,
                 local_138.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
                 super__Vector_impl_data._M_start + rVar10);
    }
    pvVar8 = local_88;
    std::vector<Occupy,std::allocator<Occupy>>::vector<std::_Rb_tree_const_iterator<Occupy>,void>
              (local_88,local_100,(_Base_ptr)(local_118 + 8),(allocator_type *)&local_98);
    std::
    _Rb_tree<Occupy,_Occupy,_std::_Identity<Occupy>,_std::less<Occupy>,_std::allocator<Occupy>_>::
    ~_Rb_tree((_Rb_tree<Occupy,_Occupy,_std::_Identity<Occupy>,_std::less<Occupy>,_std::allocator<Occupy>_>
               *)local_118);
    std::vector<Occupy,_std::allocator<Occupy>_>::~vector(&local_138);
    std::
    _Rb_tree<Occupy,_Occupy,_std::_Identity<Occupy>,_std::less<Occupy>,_std::allocator<Occupy>_>::
    ~_Rb_tree(&local_60);
    return (vector<Occupy,_std::allocator<Occupy>_> *)pvVar8;
  }
  __assert_fail("peak_time_stamp > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LyricZhao[P]DLMO/schedule.hpp"
                ,0x235,
                "static std::vector<Occupy> Common::analyzeOccupies(TaskHandle &, size_t, uint64_t)"
               );
}

Assistant:

static std::vector<Occupy> analyzeOccupies(TaskHandle &head, size_t peak_memory, uint64_t origin_time) {
        // Run this function after running analyzeTopology and analyzeMemory
        // Mark tasks and get the peak one
        int time_stamp = 0, peak_time_stamp = 0;
        LOOP(task, head) {
            task->time_stamp = ++ time_stamp;
            if (task->execution_memory == peak_memory) {
                peak_time_stamp = time_stamp;
            }
        }
        assert(peak_time_stamp > 0);

        // Check
        auto append = [](Occupy &occupy) -> bool {
            auto &gen = occupy.gen;
            auto &use = occupy.use;
            occupy.re_gen_ins.insert(gen->ins.begin(), gen->ins.end());

            // We're going to put `gen` before `use`, so we must ensure the inputs of `gen` will not change
            static constexpr int RE_GEN_TASK_LIMIT = 3;
            for (int i = -1; i < RE_GEN_TASK_LIMIT; ++ i) {
                bool found = false;
                OperandUsage bad_usage;
                for (auto &usage: occupy.re_gen_ins) {
                    auto last_gen_before_re_gen = usage.next_gen;
                    while (last_gen_before_re_gen) {
                        auto &re_gen = last_gen_before_re_gen->find(usage.operand);
                        if (re_gen.next_gen and re_gen.next_gen->time_stamp < use->time_stamp) {
                            last_gen_before_re_gen = re_gen.next_gen;
                        } else {
                            break;
                        }
                    }
                    if (last_gen_before_re_gen and last_gen_before_re_gen->time_stamp < use->time_stamp) {
                        auto &re_gen = last_gen_before_re_gen->find(usage.operand);
                        if (re_gen.version != usage.version) {
                            found = true;
                            bad_usage = usage;
                            break;
                        }
                    }
                }
                if (found) {
                    occupy.re_gen.push_back(bad_usage.gen);
                    occupy.re_gen_ins.erase(bad_usage);
                    occupy.re_gen_ins.insert(bad_usage.gen->ins.begin(), bad_usage.gen->ins.end());
                } else {
                    return true;
                }
            }
            return false;
        };

        // Get all occupying pairs
        std::set<Occupy> occupies;
        LOOP(task, head) {
            if (peak_time_stamp >= task->time_stamp) {
                continue;
            }
            for (auto &usage: task->ins) {
                if (usage.gen and usage.gen->time_stamp < peak_time_stamp) {
                    auto occupy = Occupy {usage.gen, task};
                    // .count is a must, because we only accept the first usage
                    if (not occupies.count(occupy) and append(occupy)) {
                        occupies.insert(occupy);
                    }
                }
            }
        }

        // Get scores
        std::vector<Occupy> occupies_vec;
        for (auto &occupy: occupies) {
            auto copied = occupy;
            copied.calculate(peak_time_stamp, peak_memory, origin_time);
            occupies_vec.push_back(copied);
        }

        // O1 Pruning
        std::set<Occupy> essentials;
        std::sort(occupies_vec.begin(), occupies_vec.end(), [](const Occupy &o1, const Occupy &o2) {
            return o1.score1 < o2.score1;
        });
        int size = occupies_vec.size();
        for (int i = 0; i < size and i < O1_OCCUPIES_LIMIT; ++ i) {
            // printf(" > s1: %.3lf s2: %.3lf\n", occupies_vec[i].score1, occupies_vec[i].score2);
            essentials.insert(occupies_vec[i]);
        }

        // O2 Pruning
        std::sort(occupies_vec.begin(), occupies_vec.end(), [](const Occupy &o1, const Occupy &o2) {
            return o1.score2 < o2.score2;
        });
        for (int i = 0; i < size and i < O2_OCCUPIES_LIMIT; ++ i) {
            // printf(" > s1: %.3lf s2: %.3lf\n", occupies_vec[i].score1, occupies_vec[i].score2);
            essentials.insert(occupies_vec[i]);
        }

        // Random
        auto random = Random(0, TIMES_PER_RANDOM);
        if (not occupies_vec.empty() and random() == 0) {
            auto pos = Random(0, size)();
            essentials.insert(occupies_vec[pos]);
        }

        return std::vector<Occupy>(essentials.begin(), essentials.end());
    }